

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_es5_conformance.cpp
# Opt level: O1

void test_main(void)

{
  int iVar1;
  undefined1 *puVar2;
  char *pcVar3;
  bool bVar4;
  double dVar5;
  version vVar6;
  wstring *pwVar7;
  int *piVar8;
  unicode *puVar9;
  source_file *this;
  long lVar10;
  wostream *pwVar11;
  long lVar12;
  uint *puVar13;
  string *psVar14;
  ostream *poVar15;
  runtime_error *this_00;
  char *in_RCX;
  char *pcVar16;
  wstring *pwVar17;
  undefined8 uVar18;
  undefined1 *puVar19;
  long lVar20;
  string_view in;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  wstring_view in_03;
  interpreter interpreter_;
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> bs;
  value res;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> code;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> helper_code;
  wostringstream woss;
  gc_heap h;
  int local_30c;
  _Head_base<0UL,_mjs::source_file_*,_false> local_308;
  undefined4 local_2fc;
  ulong local_2f8;
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [32];
  runtime_error *local_2b0;
  value local_2a8;
  wstring local_280;
  long local_260;
  wchar_t *local_258;
  gc_heap *local_250;
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  wstring local_218 [11];
  gc_heap local_a0;
  
  vVar6 = tested_version();
  if (vVar6 == es5) {
    mjs::gc_heap::gc_heap(&local_a0,0x100000);
    in._M_str = in_RCX;
    in._M_len = (size_t)
                "\n// ----------------------------------------------\n// helpers that unittests can use (typically in\n// their prereq function).\n// ----------------------------------------------\nfunction fnExists(/*arguments*/) {\n  for (var i=0; i<arguments.length; i++) {\n     if (typeof(arguments[i]) !== \"function\") return false;\n     }\n  return true;\n}\n\nfunction fnGlobalObject() {\n  return (function () {return this}).call(null);\n  }\n\nfunction compareValues(v1, v2)\n{\n  if (v1 === 0 && v2 === 0)\n    return 1 / v1 === 1 / v2;\n  if (v1 !== v1 && v2 !== v2)\n    return true;\n  return v1 === v2;\n}\n\nfunction isSubsetOf(aSubset, aArray) {\n  if (aArray.length < aSubset.length) {\n    return false;\n  }\n\n  var sortedSubset = [].concat(aSubset).sort();\n  var sortedArray = [].concat(aArray).sort();\n\n  nextSubsetMember:\n  for (var i = 0, j = 0; i < sortedSubset.length; i++) {\n    var v = sortedSubset[i];\n    while (j < sortedArray.length) {\n      if (compareValues(v, sortedArray[j++])) {\n        continue nextSubsetMember;\n      }\n    }\n\n    return false;\n  }\n\n  return true;\n}\n"
    ;
    mjs::unicode::utf8_to_utf16_abi_cxx11_(local_218,(unicode *)0x424,in);
    pwVar7 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_218);
    std::__cxx11::wstring::wstring((wstring *)local_238,pwVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_218[0]._M_dataplus._M_p != &local_218[0].field_2) {
      operator_delete(local_218[0]._M_dataplus._M_p,
                      local_218[0].field_2._M_allocated_capacity * 4 + 4);
    }
    local_30c = 0;
    local_2f8 = 0;
    do {
      iVar1 = local_30c;
      piVar8 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                         (expected_failures,"N3mjs9gc_stringE",&local_30c);
      lVar20 = (long)iVar1;
      pcVar16 = (char *)(ulong)(local_a0.alloc_context_.capacity_ - local_a0.alloc_context_.start_);
      if (0x32 < (int)(((ulong)(local_a0.alloc_context_.next_free_ - local_a0.alloc_context_.start_)
                       * 100) / (ulong)pcVar16)) {
        mjs::gc_heap::garbage_collect(&local_a0);
      }
      local_260 = std::chrono::_V2::system_clock::now();
      pcVar3 = tests[lVar20].prelude;
      puVar9 = (unicode *)strlen(pcVar3);
      in_00._M_str = pcVar16;
      in_00._M_len = (size_t)pcVar3;
      mjs::unicode::utf8_to_utf16_abi_cxx11_(&local_280,puVar9,in_00);
      pwVar7 = (wstring *)
               std::__cxx11::wstring::_M_append((wchar_t *)&local_280,(ulong)local_238[0]);
      std::__cxx11::wstring::wstring((wstring *)local_2f0,pwVar7);
      pwVar7 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_2f0);
      std::__cxx11::wstring::wstring((wstring *)&local_2a8,pwVar7);
      pcVar3 = tests[lVar20].code;
      puVar9 = (unicode *)strlen(pcVar3);
      in_01._M_str = pcVar16;
      in_01._M_len = (size_t)pcVar3;
      mjs::unicode::utf8_to_utf16_abi_cxx11_((wstring *)local_2d0,puVar9,in_01);
      uVar18 = (undefined1 *)0x3;
      if (local_2a8._0_8_ != (long)&local_2a8 + 0x10U) {
        uVar18 = local_2a8.field_1._8_8_;
      }
      puVar2 = (undefined1 *)
               ((long)&((local_2a8.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.
                         super_gc_heap_ptr_untyped.heap_)->pointers_).set_ + local_2d0._8_8_);
      pcVar16 = (char *)local_2a8._0_8_;
      if ((ulong)uVar18 < puVar2) {
        puVar19 = (undefined1 *)0x3;
        if ((statement *)local_2d0._0_8_ != (statement *)(local_2d0 + 0x10)) {
          puVar19 = (undefined1 *)local_2d0._16_8_;
        }
        if (puVar19 < puVar2) goto LAB_0012f9bd;
        pwVar7 = (wstring *)
                 std::__cxx11::wstring::replace((ulong)local_2d0,0,(wchar_t *)0x0,local_2a8._0_8_);
      }
      else {
LAB_0012f9bd:
        pwVar7 = (wstring *)std::__cxx11::wstring::_M_append((wchar_t *)&local_2a8,local_2d0._0_8_);
      }
      std::__cxx11::wstring::wstring((wstring *)local_218,pwVar7);
      pwVar7 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_218);
      std::__cxx11::wstring::wstring((wstring *)&local_258,pwVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_218[0]._M_dataplus._M_p != &local_218[0].field_2) {
        operator_delete(local_218[0]._M_dataplus._M_p,
                        local_218[0].field_2._M_allocated_capacity * 4 + 4);
      }
      if ((statement *)local_2d0._0_8_ != (statement *)(local_2d0 + 0x10)) {
        operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ * 4 + 4);
      }
      if (local_2a8._0_8_ != (long)&local_2a8 + 0x10U) {
        operator_delete((void *)local_2a8._0_8_,local_2a8.field_1._8_8_ * 4 + 4);
      }
      if ((gc_heap *)local_2f0._0_8_ != (gc_heap *)(local_2f0 + 0x10)) {
        operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity * 4 + 4);
      }
      pcVar3 = tests[lVar20].id;
      puVar9 = (unicode *)strlen(pcVar3);
      in_02._M_str = pcVar16;
      in_02._M_len = (size_t)pcVar3;
      mjs::unicode::utf8_to_utf16_abi_cxx11_(local_218,puVar9,in_02);
      this = (source_file *)operator_new(0x48);
      local_2a8._0_8_ = local_218[0]._M_string_length;
      local_2a8.field_1.n_ = (double)local_218[0]._M_dataplus._M_p;
      local_2f0._0_8_ = local_250;
      local_2f0._8_8_ = local_258;
      mjs::source_file::source_file(this,(wstring_view *)&local_2a8,(wstring_view *)local_2f0,es5);
      local_308._M_head_impl = this;
      std::__shared_ptr<mjs::source_file,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mjs::source_file,std::default_delete<mjs::source_file>,void>
                ((__shared_ptr<mjs::source_file,(__gnu_cxx::_Lock_policy)2> *)&local_280,
                 (unique_ptr<mjs::source_file,_std::default_delete<mjs::source_file>_> *)&local_308)
      ;
      mjs::parse((mjs *)local_2d0,(shared_ptr<mjs::source_file> *)&local_280,non_strict);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._M_string_length);
      }
      if (local_308._M_head_impl != (source_file *)0x0) {
        std::default_delete<mjs::source_file>::operator()
                  ((default_delete<mjs::source_file> *)&local_308,local_308._M_head_impl);
      }
      local_308._M_head_impl = (source_file *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_218[0]._M_dataplus._M_p != &local_218[0].field_2) {
        operator_delete(local_218[0]._M_dataplus._M_p,
                        local_218[0].field_2._M_allocated_capacity * 4 + 4);
      }
      lVar10 = std::chrono::_V2::system_clock::now();
      local_218[0].field_2._M_allocated_capacity = (code *)0x0;
      local_218[0].field_2._8_8_ = 0;
      local_218[0]._M_dataplus._M_p = (pointer)0x0;
      local_218[0]._M_string_length = 0;
      pwVar17 = local_218;
      mjs::interpreter::interpreter
                ((interpreter *)&local_308,&local_a0,es5,(on_statement_executed_type *)local_218);
      if ((code *)local_218[0].field_2._0_8_ != (code *)0x0) {
        (*(code *)local_218[0].field_2._0_8_)(local_218,local_218,3);
      }
      mjs::interpreter::eval(&local_2a8,(interpreter *)&local_308,(statement *)local_2d0._0_8_);
      if ((local_2a8.type_ != boolean) || (local_2a8.field_1.b_ == false)) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_218);
        pwVar11 = std::operator<<((wostream *)local_218,"Unexpected result: ");
        mjs::to_string((mjs *)local_2f0,&local_a0,&local_2a8);
        puVar13 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_2f0);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  (pwVar11,(wchar_t *)(puVar13 + 1),(ulong)*puVar13);
        mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_2f0);
        local_2b0 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::wstringbuf::str();
        in_03._M_str = (wchar_t *)pwVar17;
        in_03._M_len = (size_t)local_280._M_dataplus._M_p;
        psVar14 = mjs::unicode::utf16_to_utf8_abi_cxx11_
                            ((string *)local_2f0,(unicode *)local_280._M_string_length,in_03);
        local_2fc = (undefined4)CONCAT71((int7)((ulong)psVar14 >> 8),1);
        std::runtime_error::runtime_error(local_2b0,(string *)local_2f0);
        local_2fc = 0;
        __cxa_throw(local_2b0,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (piVar8 != (int *)"N3mjs9gc_stringE") {
        pwVar11 = std::operator<<((wostream *)&std::wcerr,"Test ");
        *(undefined8 *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x10) = 4;
        pwVar11 = (wostream *)std::wostream::operator<<((wostream *)pwVar11,local_30c);
        pwVar11 = std::operator<<(pwVar11," passed: ");
        lVar12 = *(long *)pwVar11;
        *(undefined8 *)(pwVar11 + *(long *)(lVar12 + -0x18) + 0x10) = 0x14;
        lVar12 = *(long *)(lVar12 + -0x18);
        *(uint *)(pwVar11 + lVar12 + 0x18) = *(uint *)(pwVar11 + lVar12 + 0x18) & 0xffffff4f | 0x20;
        pwVar11 = std::operator<<(pwVar11,pcVar3);
        *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) =
             *(uint *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x18) & 0xffffff4f | 0x80;
        pwVar11 = std::operator<<(pwVar11," ");
        pwVar11 = std::operator<<(pwVar11,tests[lVar20].description);
        std::operator<<(pwVar11," -- EXPECTED FAILURE\n");
        local_2f8 = (ulong)((int)local_2f8 + 1);
      }
      mjs::value::destroy(&local_2a8);
      mjs::interpreter::~interpreter((interpreter *)&local_308);
      if ((statement *)local_2d0._0_8_ != (statement *)0x0) {
        (**(code **)(*(long *)local_2d0._0_8_ + 8))();
      }
      if (local_258 != (wchar_t *)local_248) {
        operator_delete(local_258,local_248[0] * 4 + 4);
      }
      lVar12 = std::chrono::_V2::system_clock::now();
      dVar5 = (double)(lVar12 - lVar10) / 1000000000.0;
      if (1.0 < dVar5) {
        *(undefined8 *)(std::locale::~locale + *(long *)(std::wcout + -0x18)) = 4;
        pwVar11 = (wostream *)std::wostream::operator<<((wostream *)&std::wcout,local_30c);
        pwVar11 = std::operator<<(pwVar11," ");
        *(undefined8 *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x10) = 10;
        pwVar11 = std::wostream::_M_insert<double>
                            (((double)(lVar10 - local_260) / 1000000000.0) * 1000.0);
        pwVar11 = std::operator<<(pwVar11," ");
        *(undefined8 *)(pwVar11 + *(long *)(*(long *)pwVar11 + -0x18) + 0x10) = 10;
        pwVar11 = std::wostream::_M_insert<double>(dVar5 * 1000.0);
        pwVar11 = std::operator<<(pwVar11," ");
        pwVar11 = std::operator<<(pwVar11,tests[lVar20].id);
        std::operator<<(pwVar11," is slow\n");
      }
      iVar1 = local_30c + 1;
      bVar4 = local_30c < 0x4d6;
      local_30c = iVar1;
    } while (bVar4);
    if ((int)local_2f8 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      poVar15 = (ostream *)std::ostream::operator<<((ostream *)local_218,(int)local_2f8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," unexpected result(s)",0x15);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,(string *)&local_2a8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_238[0] != local_228) {
      operator_delete(local_238[0],local_228[0] * 4 + 4);
    }
    mjs::gc_heap::~gc_heap(&local_a0);
  }
  return;
}

Assistant:

void test_main() {
    if (tested_version() != version::es5) {
        return;
    }

    constexpr int num_tests = sizeof(tests)/sizeof(*tests);
    gc_heap h{1<<20};
    int unexpected = 0;
    const auto helper_code = unicode::utf8_to_utf16(helper_functions) + L";";
    for (int i = 0; i < num_tests; ++i) {
        const auto& t = tests[i];
        const bool expect_failure = std::find(std::begin(expected_failures), std::end(expected_failures), i) != std::end(expected_failures);

        //std::wcout << std::setw(4) <<  (i+1) << "/" << num_tests << "\r" << std::flush;

        std::chrono::high_resolution_clock::time_point t0, t1, t2;

        try {
            if (h.use_percentage() > 50) {
                h.garbage_collect();
            }

            t0 = std::chrono::high_resolution_clock::now();

            auto code = unicode::utf8_to_utf16(t.prelude) +  helper_code + L"(function(){" + unicode::utf8_to_utf16(t.code) + L"})()";
            auto bs = parse(std::make_unique<source_file>(unicode::utf8_to_utf16(t.id), code, version::es5));

            t1 = std::chrono::high_resolution_clock::now();

            // Could be optimized to reuse interpreter but take to restore global object
            interpreter interpreter_{h, version::es5};
            auto res = interpreter_.eval(*bs);
            if (res.type() != value_type::boolean || !res.boolean_value()) {
                std::wostringstream woss;
                woss << "Unexpected result: " << to_string(h, res).view();
                throw std::runtime_error(unicode::utf16_to_utf8(woss.str()));
            }
            if (expect_failure) {
                std::wcerr << "Test " << std::setw(4) << i << " passed: " << std::setw(20) << std::left << t.id << std::right << " " <<  t.description << " -- EXPECTED FAILURE\n";
                ++unexpected;
            }
        } catch (const std::exception& e) {
            if (!expect_failure) {
                std::wcerr << "Test " << std::setw(4) << i << " failed: " << std::setw(20) << std::left << t.id << std::right << " " <<  t.description << "\n";
                std::wcerr << e.what() << "\n";
            }
            if (!expect_failure) {
                ++unexpected;
            }
        }

        t2 = std::chrono::high_resolution_clock::now();

        const auto d0 = std::chrono::duration<double>(t1-t0).count();
        const auto d1 = std::chrono::duration<double>(t2-t1).count();
        if (d1>1) {
            std::wcout << std::setw(4) << i << " " << std::setw(10) << d0*1000 << " " << std::setw(10) << d1*1000 << " " << t.id << " is slow\n";
        }
    }
    if (unexpected) {
        std::ostringstream oss;
        oss << unexpected << " unexpected result(s)";
        throw std::runtime_error(oss.str());
    }
}